

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void d_fail(char *str,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1e8 [8];
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined4 local_138;
  undefined4 local_134;
  va_list ap;
  char local_118 [8];
  char nstr [256];
  char *str_local;
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_1e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_134 = 0x30;
  local_138 = 8;
  local_1e0 = in_RSI;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  snprintf(local_118,0xff,"fail: %s\n",str);
  vfprintf(_stderr,local_118,&local_138);
  exit(1);
}

Assistant:

void d_fail(const char *str, ...) {
  char nstr[256];
  va_list ap;
  va_start(ap, str);
  snprintf(nstr, 255, "fail: %s\n", str);
  vfprintf(stderr, nstr, ap);
  va_end(ap);
  exit(1);
}